

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O0

bool_t decIsValid(char *dec)

{
  bool_t bVar1;
  char *in_RDI;
  bool_t local_4;
  
  bVar1 = strIsValid(in_RDI);
  if (bVar1 == 0) {
    local_4 = 0;
  }
  else {
    for (; *in_RDI != '\0'; in_RDI = in_RDI + 1) {
      if ((*in_RDI < '0') || ('9' < *in_RDI)) {
        return 0;
      }
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

bool_t decIsValid(const char* dec)
{
	if (!strIsValid(dec))
		return FALSE;
	for (; *dec; ++dec)
		if (*dec < '0' || *dec > '9')
			return FALSE;
	return TRUE;
}